

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Easy.cpp
# Opt level: O1

void __thiscall curlpp::Easy::reset(Easy *this)

{
  OptionList OStack_48;
  
  internal::CurlHandle::reset((this->mCurl)._M_ptr);
  internal::OptionList::OptionList(&OStack_48);
  internal::OptionList::setOpt(&this->mOptions,&OStack_48);
  internal::OptionList::~OptionList(&OStack_48);
  return;
}

Assistant:

void
curlpp::Easy::reset ()
{
	mCurl->reset();
	mOptions.setOpt(internal::OptionList());
}